

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_calculate_seek_points
                    (ma_dr_mp3 *pMP3,ma_uint32 *pSeekPointCount,ma_dr_mp3_seek_point *pSeekPoints)

{
  ma_bool32 mVar1;
  ma_uint32 mVar2;
  undefined8 *in_RDX;
  uint *in_RSI;
  ma_dr_mp3 *in_RDI;
  ma_uint32 pcmFramesInCurrentMP3FrameIn_1;
  size_t i;
  ma_uint32 pcmFramesInCurrentMP3FrameIn;
  ma_uint32 iSeekPoint;
  ma_uint32 iMP3Frame;
  ma_uint64 nextTargetPCMFrame;
  float runningPCMFrameCountFractionalPart;
  ma_uint64 runningPCMFrameCount;
  ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo [3];
  ma_uint64 pcmFramesBetweenSeekPoints;
  ma_uint64 totalPCMFrameCount;
  ma_uint64 totalMP3FrameCount;
  ma_uint64 currentPCMFrame;
  ma_uint32 seekPointCount;
  ma_dr_mp3 *in_stack_ffffffffffffff48;
  ulong local_a8;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar3;
  ma_uint64 *in_stack_ffffffffffffff70;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ma_uint64 local_80;
  ulong local_78 [7];
  ulong local_40;
  ulong local_38;
  ma_uint64 local_30;
  uint local_24;
  undefined8 *local_20;
  uint *local_18;
  ma_dr_mp3 *local_10;
  ma_bool32 local_4;
  
  if (((in_RDI == (ma_dr_mp3 *)0x0) || (in_RSI == (uint *)0x0)) || (in_RDX == (undefined8 *)0x0)) {
    local_4 = 0;
  }
  else {
    local_24 = *in_RSI;
    if (local_24 == 0) {
      local_4 = 0;
    }
    else {
      local_30 = in_RDI->currentPCMFrame;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      mVar1 = ma_dr_mp3_get_mp3_and_pcm_frame_count
                        ((ma_dr_mp3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70,
                         (ma_uint64 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
      ;
      if (mVar1 == 0) {
        local_4 = 0;
      }
      else {
        if (local_38 < 3) {
          local_24 = 1;
          *local_20 = 0;
          local_20[1] = 0;
          *(undefined2 *)(local_20 + 2) = 0;
          *(undefined2 *)((long)local_20 + 0x12) = 0;
        }
        else {
          local_80 = 0;
          if (local_38 - 1 < (ulong)local_24) {
            local_24 = (int)local_38 - 1;
          }
          local_78[6] = local_40 / (local_24 + 1);
          mVar1 = ma_dr_mp3_seek_to_start_of_stream(in_stack_ffffffffffffff48);
          if (mVar1 == 0) {
            return 0;
          }
          for (uVar3 = 0; uVar3 < 3; uVar3 = uVar3 + 1) {
            local_78[(ulong)uVar3 * 2] = local_10->streamCursor - local_10->dataSize;
            local_78[(ulong)uVar3 * 2 + 1] = local_80;
            mVar2 = ma_dr_mp3_decode_next_frame_ex
                              (in_stack_ffffffffffffff48,(ma_dr_mp3d_sample_t *)0x204432);
            if (mVar2 == 0) {
              return 0;
            }
            ma_dr_mp3__accumulate_running_pcm_frame_count
                      (local_10,mVar2,&local_80,(float *)&stack0xffffffffffffff7c);
          }
          uVar4 = 0;
          for (uVar3 = 0; uVar3 < local_24; uVar3 = uVar3 + 1) {
            uVar4 = local_78[6] + uVar4;
            while (local_80 <= uVar4) {
              for (local_a8 = 0; local_a8 < 2; local_a8 = local_a8 + 1) {
                local_78[local_a8 * 2] = local_78[(local_a8 + 1) * 2];
                local_78[local_a8 * 2 + 1] = local_78[(local_a8 + 1) * 2 + 1];
              }
              local_78[4] = local_10->streamCursor - local_10->dataSize;
              local_78[5] = local_80;
              mVar2 = ma_dr_mp3_decode_next_frame_ex
                                (in_stack_ffffffffffffff48,(ma_dr_mp3d_sample_t *)0x2045c1);
              if (mVar2 == 0) {
                local_20[(ulong)uVar3 * 3] = local_78[0];
                local_20[(ulong)uVar3 * 3 + 1] = uVar4;
                *(undefined2 *)(local_20 + (ulong)uVar3 * 3 + 2) = 2;
                *(short *)((long)local_20 + (ulong)uVar3 * 0x18 + 0x12) =
                     (short)uVar4 - (short)local_78[3];
                goto LAB_00204662;
              }
              ma_dr_mp3__accumulate_running_pcm_frame_count
                        (local_10,mVar2,&local_80,(float *)&stack0xffffffffffffff7c);
            }
            local_20[(ulong)uVar3 * 3] = local_78[0];
            local_20[(ulong)uVar3 * 3 + 1] = uVar4;
            *(undefined2 *)(local_20 + (ulong)uVar3 * 3 + 2) = 2;
            *(short *)((long)local_20 + (ulong)uVar3 * 0x18 + 0x12) =
                 (short)uVar4 - (short)local_78[3];
LAB_00204662:
          }
          mVar1 = ma_dr_mp3_seek_to_start_of_stream(in_stack_ffffffffffffff48);
          if (mVar1 == 0) {
            return 0;
          }
          mVar1 = ma_dr_mp3_seek_to_pcm_frame(in_stack_ffffffffffffff48,0x2046a8);
          if (mVar1 == 0) {
            return 0;
          }
        }
        *local_18 = local_24;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_calculate_seek_points(ma_dr_mp3* pMP3, ma_uint32* pSeekPointCount, ma_dr_mp3_seek_point* pSeekPoints)
{
    ma_uint32 seekPointCount;
    ma_uint64 currentPCMFrame;
    ma_uint64 totalMP3FrameCount;
    ma_uint64 totalPCMFrameCount;
    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return MA_FALSE;
    }
    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return MA_FALSE;
    }
    currentPCMFrame = pMP3->currentPCMFrame;
    if (!ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return MA_FALSE;
    }
    if (totalMP3FrameCount < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        ma_uint64 pcmFramesBetweenSeekPoints;
        ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1];
        ma_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        ma_uint64 nextTargetPCMFrame;
        ma_uint32 iMP3Frame;
        ma_uint32 iSeekPoint;
        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (ma_uint32)totalMP3FrameCount-1;
        }
        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        for (iMP3Frame = 0; iMP3Frame < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            ma_uint32 pcmFramesInCurrentMP3FrameIn;
            MA_DR_MP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;
            pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return MA_FALSE;
            }
            ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;
            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    ma_uint32 pcmFramesInCurrentMP3FrameIn;
                    for (i = 0; i < MA_DR_MP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;
                    pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }
                    ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        if (!ma_dr_mp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return MA_FALSE;
        }
    }
    *pSeekPointCount = seekPointCount;
    return MA_TRUE;
}